

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool trimProp(Property prop)

{
  Property prop_local;
  bool local_1;
  
  local_1 = prop == TrimStart || prop == TrimEnd;
  return local_1;
}

Assistant:

static bool trimProp(rlottie::Property prop)
{
    switch (prop) {
    case rlottie::Property::TrimStart:
    case rlottie::Property::TrimEnd:
        return true;
    default:
        return false;
    }
}